

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_proc_split_cfg(MppEncSliceSplit *dst,MppEncSliceSplit *src)

{
  uint uVar1;
  RK_U32 change;
  MPP_RET ret;
  MppEncSliceSplit *src_local;
  MppEncSliceSplit *dst_local;
  
  uVar1 = src->change;
  if ((uVar1 & 1) != 0) {
    dst->split_mode = src->split_mode;
    dst->split_arg = src->split_arg;
  }
  if ((uVar1 & 2) != 0) {
    dst->split_arg = src->split_arg;
  }
  dst->change = uVar1 | dst->change;
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_proc_split_cfg(MppEncSliceSplit *dst, MppEncSliceSplit *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change & MPP_ENC_SPLIT_CFG_CHANGE_MODE) {
        dst->split_mode = src->split_mode;
        dst->split_arg = src->split_arg;
    }

    if (change & MPP_ENC_SPLIT_CFG_CHANGE_ARG)
        dst->split_arg = src->split_arg;

    dst->change |= change;

    return ret;
}